

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::DeadBranchElimPass::MarkLiveBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks)

{
  pair<spvtools::opt::BasicBlock_*,_unsigned_int> *ppVar1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var2;
  Instruction *this_00;
  pointer pOVar3;
  uint **ppuVar4;
  IRContext *this_01;
  StructuredCFGAnalysis *this_02;
  bool bVar5;
  char cVar6;
  bool bVar7;
  uint32_t uVar8;
  uint32_t header_id;
  uint32_t merge_id;
  size_type sVar9;
  iterator iVar10;
  uint **ppuVar11;
  pointer pOVar12;
  uint uVar13;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>,_bool> pVar14;
  uint32_t live_lab_id;
  BasicBlock *block;
  bool condVal;
  uint32_t icnt;
  uint32_t sel_val;
  vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
  conditions_to_simplify;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> stack;
  uint32_t case_val;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  blocks_with_backedge;
  uint32_t local_f4;
  DebugScope local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  undefined1 local_c0 [8];
  pair<spvtools::opt::BasicBlock_*,_unsigned_int> *local_b8;
  iterator iStack_b0;
  pair<spvtools::opt::BasicBlock_*,_unsigned_int> *local_a8;
  Function *local_98;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Stack_90;
  Instruction *local_88;
  IRContext *local_78;
  undefined1 local_6c [12];
  IRContext *local_60;
  __node_base local_58;
  pointer pOStack_50;
  float local_48;
  pointer local_40;
  pointer pIStack_38;
  
  local_b8 = (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)0x0;
  iStack_b0._M_current = (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)0x0;
  local_a8 = (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)0x0;
  local_6c._4_8_ = &pIStack_38;
  local_60 = (IRContext *)0x1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  pOStack_50 = (pointer)0x0;
  local_48 = 1.0;
  local_40 = (pointer)0x0;
  pIStack_38 = (pointer)0x0;
  local_88 = (Instruction *)0x0;
  local_98 = (Function *)0x0;
  _Stack_90._M_head_impl = (Instruction *)0x0;
  local_e8._M_unused._0_8_ =
       (undefined8)
       (((func->blocks_).
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t;
  std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
  emplace_back<spvtools::opt::BasicBlock*>
            ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
             &local_98,(BasicBlock **)&local_e8);
  if (local_98 != (Function *)_Stack_90._M_head_impl) {
    do {
      local_f0 = *(DebugScope *)((long)_Stack_90._M_head_impl + -8);
      _Stack_90._M_head_impl = _Stack_90._M_head_impl + -8;
      local_e8._M_unused._M_object = live_blocks;
      pVar14 = std::
               _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               ::
               _M_insert<spvtools::opt::BasicBlock*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
                         ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)live_blocks,&local_f0,&local_e8);
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar8 = BasicBlock::ContinueBlockIdIfAny((BasicBlock *)local_f0);
        if (uVar8 != 0) {
          _Var2._M_head_impl =
               (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)((long)local_f0 + 8))->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          header_id = 0;
          if ((_Var2._M_head_impl)->has_result_id_ == true) {
            header_id = Instruction::GetSingleWordOperand
                                  (_Var2._M_head_impl,(uint)(_Var2._M_head_impl)->has_type_id_);
          }
          merge_id = BasicBlock::MergeBlockIdIfAny((BasicBlock *)local_f0);
          AddBlocksWithBackEdge
                    (this,uVar8,header_id,merge_id,
                     (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)(local_6c + 4));
        }
        if ((*(Instruction **)((long)local_f0 + 0x20) == (Instruction *)0x0) ||
           (((*(Instruction **)((long)local_f0 + 0x20))->
            super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
          __assert_fail("!insts_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                        ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
        }
        this_00 = *(Instruction **)((long)local_f0 + 0x28);
        local_f4 = 0;
        if (this_00->opcode_ == OpSwitch) {
          uVar8 = (this_00->has_result_id_ & 1) + 1;
          if (this_00->has_type_id_ == false) {
            uVar8 = (uint)this_00->has_result_id_;
          }
          uVar8 = Instruction::GetSingleWordOperand(this_00,uVar8);
          bVar5 = GetConstInteger(this,uVar8,(uint32_t *)(local_c0 + 4));
          if (bVar5) {
            local_c0._0_4_ = 0;
            local_d8 = (code *)0x0;
            pcStack_d0 = (code *)0x0;
            local_e8._M_unused._M_object = (void *)0x0;
            local_e8._8_8_ = (DeadBranchElimPass *)0x0;
            local_e8._M_unused._M_object = operator_new(0x20);
            ((BasicBlock *)local_e8._M_unused._0_8_)->function_ = (Function *)local_c0;
            (((BasicBlock *)local_e8._M_unused._0_8_)->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
                 (Instruction *)local_6c;
            (((BasicBlock *)local_e8._M_unused._0_8_)->insts_).
            super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
                 (_func_int **)(local_c0 + 4);
            (((BasicBlock *)local_e8._M_unused._0_8_)->insts_).
            super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
                 (_func_int **)&local_f4;
            pcStack_d0 = std::
                         _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:128:13)>
                         ::_M_invoke;
            local_d8 = std::
                       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:128:13)>
                       ::_M_manager;
            pOVar3 = (this_00->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pOVar12 = (this_00->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start; pOVar12 != pOVar3;
                pOVar12 = pOVar12 + 1) {
              if ((pOVar12->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
                ppuVar4 = (uint **)(pOVar12->words).large_data_._M_t.
                                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                   ._M_head_impl;
                ppuVar11 = &(pOVar12->words).small_data_;
                if (ppuVar4 != (uint **)0x0) {
                  ppuVar11 = ppuVar4;
                }
                local_78 = (IRContext *)*ppuVar11;
                if (local_d8 == (code *)0x0) {
                  std::__throw_bad_function_call();
                }
                cVar6 = (*pcStack_d0)(&local_e8,(uint *)&local_78);
                if (cVar6 == '\0') break;
              }
            }
            if (local_d8 != (code *)0x0) {
              (*local_d8)(&local_e8,&local_e8,__destroy_functor);
            }
          }
        }
        else if (this_00->opcode_ == OpBranchConditional) {
          uVar8 = (this_00->has_result_id_ & 1) + 1;
          if (this_00->has_type_id_ == false) {
            uVar8 = (uint)this_00->has_result_id_;
          }
          uVar8 = Instruction::GetSingleWordOperand(this_00,uVar8);
          bVar5 = GetConstCondition(this,uVar8,(bool *)local_e8._M_pod_data);
          if (bVar5) {
            uVar13 = (this_00->has_result_id_ & 1) + 1;
            if (this_00->has_type_id_ == false) {
              uVar13 = (uint)this_00->has_result_id_;
            }
            local_f4 = Instruction::GetSingleWordOperand
                                 (this_00,(uVar13 - (byte)local_e8._M_pod_data[0]) + 2);
          }
        }
        if (local_f4 == 0) {
LAB_00554dfd:
          local_e8._M_unused._M_object = &local_98;
          pcStack_d0 = std::
                       _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:172:42)>
                       ::_M_invoke;
          local_d8 = std::
                     _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:172:42)>
                     ::_M_manager;
          local_e8._8_8_ = this;
          BasicBlock::ForEachSuccessorLabel
                    ((BasicBlock *)local_f0,(function<void_(unsigned_int)> *)&local_e8);
          if (local_d8 != (code *)0x0) {
            (*local_d8)(&local_e8,&local_e8,__destroy_functor);
          }
        }
        else {
          sVar9 = std::
                  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count((_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)(local_6c + 4),(key_type *)&local_f0);
          if (sVar9 != 0) {
            this_01 = (this->super_MemPass).super_Pass.context_;
            if ((this_01->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
              IRContext::BuildStructuredCFGAnalysis(this_01);
            }
            this_02 = (this_01->struct_cfg_analysis_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                      .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>.
                      _M_head_impl;
            _Var2._M_head_impl =
                 (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)((long)local_f0 + 8))->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            uVar8 = 0;
            if ((_Var2._M_head_impl)->has_result_id_ == true) {
              uVar8 = Instruction::GetSingleWordOperand
                                (_Var2._M_head_impl,(uint)(_Var2._M_head_impl)->has_type_id_);
            }
            uVar8 = StructuredCFGAnalysis::ContainingLoop(this_02,uVar8);
            if (local_f4 != uVar8) goto LAB_00554dfd;
          }
          local_e8._M_unused._M_function_pointer = (_func_void *)local_f0;
          local_e8._8_4_ = local_f4;
          if (iStack_b0._M_current == local_a8) {
            std::
            vector<std::pair<spvtools::opt::BasicBlock*,unsigned_int>,std::allocator<std::pair<spvtools::opt::BasicBlock*,unsigned_int>>>
            ::_M_realloc_insert<std::pair<spvtools::opt::BasicBlock*,unsigned_int>>
                      ((vector<std::pair<spvtools::opt::BasicBlock*,unsigned_int>,std::allocator<std::pair<spvtools::opt::BasicBlock*,unsigned_int>>>
                        *)&local_b8,iStack_b0,
                       (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)&local_e8);
          }
          else {
            (iStack_b0._M_current)->first = (BasicBlock *)local_f0;
            *(undefined8 *)&(iStack_b0._M_current)->second = local_e8._8_8_;
            iStack_b0._M_current = iStack_b0._M_current + 1;
          }
          local_e8._M_unused._M_object = GetParentBlock(this,local_f4);
          std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
          emplace_back<spvtools::opt::BasicBlock*>
                    ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>
                      *)&local_98,(BasicBlock **)&local_e8);
        }
      }
    } while (local_98 != (Function *)_Stack_90._M_head_impl);
  }
  if (iStack_b0._M_current == local_b8) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    iVar10._M_current = iStack_b0._M_current;
    do {
      ppVar1 = iVar10._M_current + -1;
      bVar7 = SimplifyBranch(this,iVar10._M_current[-1].first,iVar10._M_current[-1].second);
      bVar5 = (bool)(bVar5 | bVar7);
      iVar10._M_current = ppVar1;
    } while (ppVar1 != local_b8);
  }
  if (local_98 != (Function *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_6c + 4));
  if (local_b8 != (pair<spvtools::opt::BasicBlock_*,_unsigned_int> *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return bVar5;
}

Assistant:

bool DeadBranchElimPass::MarkLiveBlocks(
    Function* func, std::unordered_set<BasicBlock*>* live_blocks) {
  std::vector<std::pair<BasicBlock*, uint32_t>> conditions_to_simplify;
  std::unordered_set<BasicBlock*> blocks_with_backedge;
  std::vector<BasicBlock*> stack;
  stack.push_back(&*func->begin());
  bool modified = false;
  while (!stack.empty()) {
    BasicBlock* block = stack.back();
    stack.pop_back();

    // Live blocks doubles as visited set.
    if (!live_blocks->insert(block).second) continue;

    uint32_t cont_id = block->ContinueBlockIdIfAny();
    if (cont_id != 0) {
      AddBlocksWithBackEdge(cont_id, block->id(), block->MergeBlockIdIfAny(),
                            &blocks_with_backedge);
    }

    Instruction* terminator = block->terminator();
    uint32_t live_lab_id = 0;
    // Check if the terminator has a single valid successor.
    if (terminator->opcode() == spv::Op::OpBranchConditional) {
      bool condVal;
      if (GetConstCondition(terminator->GetSingleWordInOperand(0u), &condVal)) {
        live_lab_id = terminator->GetSingleWordInOperand(
            condVal ? kBranchCondTrueLabIdInIdx : kBranchCondFalseLabIdInIdx);
      }
    } else if (terminator->opcode() == spv::Op::OpSwitch) {
      uint32_t sel_val;
      if (GetConstInteger(terminator->GetSingleWordInOperand(0u), &sel_val)) {
        // Search switch operands for selector value, set live_lab_id to
        // corresponding label, use default if not found.
        uint32_t icnt = 0;
        uint32_t case_val;
        terminator->WhileEachInOperand(
            [&icnt, &case_val, &sel_val, &live_lab_id](const uint32_t* idp) {
              if (icnt == 1) {
                // Start with default label.
                live_lab_id = *idp;
              } else if (icnt > 1) {
                if (icnt % 2 == 0) {
                  case_val = *idp;
                } else {
                  if (case_val == sel_val) {
                    live_lab_id = *idp;
                    return false;
                  }
                }
              }
              ++icnt;
              return true;
            });
      }
    }

    // Don't simplify back edges unless it becomes a branch to the header. Every
    // loop must have exactly one back edge to the loop header, so we cannot
    // remove it.
    bool simplify = false;
    if (live_lab_id != 0) {
      if (!blocks_with_backedge.count(block)) {
        // This is not a back edge.
        simplify = true;
      } else {
        const auto& struct_cfg_analysis = context()->GetStructuredCFGAnalysis();
        uint32_t header_id = struct_cfg_analysis->ContainingLoop(block->id());
        if (live_lab_id == header_id) {
          // The new branch will be a branch to the header.
          simplify = true;
        }
      }
    }

    if (simplify) {
      conditions_to_simplify.push_back({block, live_lab_id});
      stack.push_back(GetParentBlock(live_lab_id));
    } else {
      // All successors are live.
      const auto* const_block = block;
      const_block->ForEachSuccessorLabel([&stack, this](const uint32_t label) {
        stack.push_back(GetParentBlock(label));
      });
    }
  }

  // Traverse |conditions_to_simplify| in reverse order.  This is done so that
  // we simplify nested constructs before simplifying the constructs that
  // contain them.
  for (auto b = conditions_to_simplify.rbegin();
       b != conditions_to_simplify.rend(); ++b) {
    modified |= SimplifyBranch(b->first, b->second);
  }

  return modified;
}